

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

ElementDocument * __thiscall Rml::Context::LoadDocument(Context *this,String *document_path)

{
  bool bVar1;
  StreamFile *this_00;
  ElementDocument *pEVar2;
  UniquePtr<Rml::StreamFile> stream;
  _Head_base<0UL,_Rml::StreamFile_*,_false> local_20;
  
  this_00 = (StreamFile *)operator_new(0x158);
  StreamFile::StreamFile(this_00);
  local_20._M_head_impl = this_00;
  bVar1 = StreamFile::Open(this_00,document_path);
  if (bVar1) {
    pEVar2 = LoadDocument(this,&(local_20._M_head_impl)->super_Stream);
  }
  else {
    pEVar2 = (ElementDocument *)0x0;
  }
  ::std::unique_ptr<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>::~unique_ptr
            ((unique_ptr<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_> *)&local_20);
  return pEVar2;
}

Assistant:

ElementDocument* Context::LoadDocument(const String& document_path)
{
	auto stream = MakeUnique<StreamFile>();

	if (!stream->Open(document_path))
		return nullptr;

	ElementDocument* document = LoadDocument(stream.get());

	return document;
}